

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O0

bool __thiscall HDD::SafetyCheck(HDD *this)

{
  bool bVar1;
  int iVar2;
  bool local_1d;
  int ch;
  HDD *this_local;
  
  bVar1 = util::is_stdout_a_tty();
  if (bVar1) {
    util::operator<<((LogHelper *)&util::cout,(char (*) [21])"Are you sure? (y/N) ");
    iVar2 = getchar();
    local_1d = iVar2 == 0x59 || iVar2 == 0x79;
    this_local._7_1_ = local_1d;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HDD::SafetyCheck()
{
    if (!util::is_stdout_a_tty())
        return false;

    util::cout << "Are you sure? (y/N) ";

    auto ch = getchar();
    return (ch == 'Y' || ch == 'y');
}